

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.h
# Opt level: O2

void __thiscall bloaty::Options::add_data_source(Options *this,char *value)

{
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/build_O2/src/bloaty.pb.h"
               ,0x534);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: value != nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pbVar1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(&this->data_source_);
  std::__cxx11::string::assign((char *)pbVar1);
  return;
}

Assistant:

inline void Options::add_data_source(const char* value) {
  GOOGLE_DCHECK(value != nullptr);
  data_source_.Add()->assign(value);
  // @@protoc_insertion_point(field_add_char:bloaty.Options.data_source)
}